

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O3

ConsumeResult * __thiscall
binlog::Session::consume<std::__cxx11::stringstream>
          (ConsumeResult *__return_storage_ptr__,Session *this,
          basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *entry;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var5;
  ulong uVar6;
  int iVar7;
  size_t sVar8;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  undefined8 uVar9;
  pointer psVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t uVar13;
  long lVar14;
  ulong uVar15;
  shared_ptr<binlog::Session::Channel> *channelptr;
  pointer psVar16;
  pointer pcVar17;
  long lVar18;
  bool bVar19;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar7 != 0) {
    uVar9 = std::__throw_system_error(iVar7);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar9);
  }
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    std::ostream::write((char *)(out + 0x10),
                        (long)((this->_clockSync)._vector.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x18));
    pcVar17 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              (-0x18 - (long)(this->_clockSync)._vector.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    __return_storage_ptr__->bytesConsumed = (size_t)pcVar17;
    this->_consumeClockSync = false;
  }
  else {
    pcVar17 = (pointer)0x0;
  }
  pcVar2 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar18 = (-(long)pcVar2 - this->_sourcesConsumePos) + -0x18;
  pbVar1 = out + 0x10;
  std::ostream::write((char *)pbVar1,(long)(pcVar2 + this->_sourcesConsumePos + 0x18));
  this->_sourcesConsumePos = (streamsize)(pcVar3 + this->_sourcesConsumePos + lVar18);
  __return_storage_ptr__->bytesConsumed = (size_t)(pcVar3 + (long)(pcVar17 + lVar18));
  psVar16 = (this->_channels).
            super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar10 = (this->_channels).
            super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar16 != psVar10) {
    do {
      p_Var4 = (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar19 = false;
      }
      else {
        bVar19 = p_Var4->_M_use_count == 1;
      }
      entry = (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
      _Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>;
      uVar6 = *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
      uVar15 = *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30);
      if (uVar6 < uVar15) {
        lVar14 = *(long *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
        uVar11 = *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) -
                 uVar15;
        uVar12 = uVar6;
        lVar18 = lVar14;
        if (*(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) <
            uVar15 || uVar11 == 0) goto LAB_001af7d4;
        lVar18 = uVar15 + lVar14;
        uVar12 = uVar11;
        uVar15 = uVar6;
      }
      else {
        uVar12 = uVar6 - uVar15;
        lVar18 = uVar15 + *(long *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl +
                                   0x28);
LAB_001af7d4:
        uVar15 = 0;
        lVar14 = 0;
      }
      uVar13 = uVar15 + uVar12;
      if (uVar13 != 0) {
        (entry->writerProp).batchSize = uVar13;
        sVar8 = consumeSpecialEntry<binlog::WriterProp,std::__cxx11::stringstream>
                          (this,&entry->writerProp,out);
        sVar8 = sVar8 + __return_storage_ptr__->bytesConsumed;
        __return_storage_ptr__->bytesConsumed = sVar8;
        std::ostream::write((char *)pbVar1,lVar18);
        if (uVar15 != 0) {
          std::ostream::write((char *)pbVar1,lVar14);
        }
        *(ulong *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30) = uVar6;
        __return_storage_ptr__->bytesConsumed = sVar8 + uVar13;
      }
      if (bVar19) {
        p_Var4 = (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_refcount._M_pi;
        (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar16->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        __return_storage_ptr__->channelsRemoved = __return_storage_ptr__->channelsRemoved + 1;
      }
      __return_storage_ptr__->channelsPolled = __return_storage_ptr__->channelsPolled + 1;
      psVar16 = psVar16 + 1;
    } while (psVar16 != psVar10);
    psVar16 = (this->_channels).
              super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar10 = (this->_channels).
              super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<std::__cxx11::stringstream>(std::__cxx11::stringstream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                      (psVar16,psVar10);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::_M_erase(&this->_channels,(iterator)__first._M_current,
             (this->_channels).
             super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  sVar8 = this->_totalConsumedBytes + __return_storage_ptr__->bytesConsumed;
  this->_totalConsumedBytes = sVar8;
  __return_storage_ptr__->totalBytesConsumed = sVar8;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}